

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Free_Games.cpp
# Opt level: O2

double __thiscall Free_Games::Free_GamesWin(Free_Games *this,double *credits,uint *bet)

{
  ostream *poVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool isInFreeGames;
  uint betInFreeGames;
  double local_138;
  Matrix mymatrix;
  Bet betFreesSpin;
  string p;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myVectorInStart;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_c8;
  Start startFreeSpin;
  PaytableWisePharaohs5 paytableForGame;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"You Won 50 Euros!");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "They will be transfered in Credit Field After Free Games!");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"3x Multiplier! on every line");
  std::endl<char,std::char_traits<char>>(poVar1);
  betInFreeGames = 0;
  p._M_dataplus._M_p = (pointer)&p.field_2;
  p._M_string_length = 0;
  p.field_2._M_local_buf[0] = '\0';
  Start::Start(&startFreeSpin);
  Matrix::Matrix(&mymatrix);
  Bet::Bet(&betFreesSpin);
  myVectorInStart.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  myVectorInStart.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  myVectorInStart.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  isInFreeGames = true;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_c8,&myVectorInStart);
  iVar2 = 1;
  PaytableWisePharaohs5::PaytableWisePharaohs5(&paytableForGame,&local_c8,*credits,*bet,true);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_c8);
  Matrix::getVectorMatrix(&local_48,&mymatrix);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_move_assign(&myVectorInStart,&local_48);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  iVar3 = 0xf;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Current Game: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    poVar1 = std::operator<<(poVar1," of ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xf);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Press \'v\' to Start a Game!");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::operator>>((istream *)&std::cin,(string *)&p);
    if ((*p._M_dataplus._M_p == 'v') && (p._M_string_length == 1)) {
      Start::takeCreditsWithBet(&startFreeSpin,credits,&betInFreeGames);
      Matrix::RandomNumbersInMatrix(&local_60,&mymatrix,&myVectorInStart);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_60);
      poVar1 = std::operator<<((ostream *)&std::cout,"---------------------------------------------"
                              );
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout," ");
      std::endl<char,std::char_traits<char>>(poVar1);
      Matrix::outPutMatrix(&mymatrix,&myVectorInStart);
      poVar1 = std::operator<<((ostream *)&std::cout,"---------------------------------------------"
                              );
      std::endl<char,std::char_traits<char>>(poVar1);
      Start::checkForCreditsAndBet(&startFreeSpin,credits,bet);
      Start::outputCreditsAndBetCurrentFreeGames(&startFreeSpin,credits,bet);
      PaytableWisePharaohs5::PaytableWisePharaohs5Win
                (&paytableForGame,&myVectorInStart,credits,bet,&isInFreeGames);
      iVar2 = iVar2 + 1;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::clear(&myVectorInStart);
  }
  local_138 = *credits;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&paytableForGame._myVectorInPaytableWisePharaohs);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&myVectorInStart);
  Bet::~Bet(&betFreesSpin);
  Matrix::~Matrix(&mymatrix);
  Start::~Start(&startFreeSpin);
  std::__cxx11::string::~string((string *)&p);
  return local_138;
}

Assistant:

double Free_Games::Free_GamesWin(double& credits, unsigned int  &bet) {
	//int currentBet = bet;
	//no bet in Free Spins
	//bet = 0;
	std::cout << "You Won 50 Euros!" << std::endl;
	std::cout << "They will be transfered in Credit Field After Free Games!" << std::endl;
	std::cout << "3x Multiplier! on every line" << std::endl;
	unsigned int betInFreeGames = 0;
	std::string p;
	Start startFreeSpin;
	Matrix mymatrix;
	Bet betFreesSpin;
	int currentGame = 1;
	std::vector<std::vector<int>>myVectorInStart;
	bool isInFreeGames = true;
	PaytableWisePharaohs5 paytableForGame(myVectorInStart, credits, bet, isInFreeGames);
	myVectorInStart = mymatrix.getVectorMatrix();
	//clears screen
	//if (system("CLS")) system("clear");
	for (int i = 0; i < FreeGamesSize; ++i) {
		std::cout << "Current Game: " << currentGame << " of " << FreeGamesSize << std::endl;
		std::cout << "Press 'v' to Start a Game!" << std::endl;
		std::cin >> p;
		if (p[0] == 'v' && p.size() == 1) {
			startFreeSpin.takeCreditsWithBet(credits, betInFreeGames);
			//need to change matrix with 6 figures! --- DONT!
			mymatrix.RandomNumbersInMatrix(myVectorInStart);
			
			std::cout << "---------------------------------------------" << std::endl; std::cout << " " << std::endl;
			mymatrix.outPutMatrix(myVectorInStart);
			std::cout << "---------------------------------------------" << std::endl;
			startFreeSpin.checkForCreditsAndBet(credits, bet);
			startFreeSpin.outputCreditsAndBetCurrentFreeGames(credits, bet);
			paytableForGame.PaytableWisePharaohs5Win(myVectorInStart, credits, bet, isInFreeGames);
			currentGame++;
		}
		/*else {
			if (i != 0) {
				i--;
			}
		}*/
		myVectorInStart.clear();
	}
	
	return credits ;
}